

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2_ref.c
# Opt level: O3

void fill_block(block *prev_block,block *ref_block,block *next_block,int with_xor)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  block blockR;
  block block_tmp;
  ulong auStack_bb8 [16];
  ulong auStack_b38 [16];
  ulong auStack_ab8 [16];
  ulong auStack_a38 [16];
  ulong auStack_9b8 [16];
  ulong auStack_938 [16];
  ulong auStack_8b8 [16];
  block *local_838;
  block local_830;
  block local_430;
  
  auStack_8b8[9] = 0x123feb;
  rxa2_copy_block(&local_830,ref_block);
  auStack_8b8[9] = 0x123ff6;
  rxa2_xor_block(&local_830,prev_block);
  auStack_8b8[9] = 0x124006;
  rxa2_copy_block(&local_430,&local_830);
  if (with_xor != 0) {
    auStack_8b8[9] = 0x12401a;
    rxa2_xor_block(&local_430,next_block);
  }
  lVar10 = 0x78;
  do {
    uVar18 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x30);
    lVar1 = *(long *)((long)auStack_8b8 + lVar10 + 0x10);
    uVar16 = (lVar1 * 2 & 0x1fffffffeU) * (uVar18 & 0xffffffff) + uVar18 + lVar1;
    uVar11 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x70) ^ uVar16;
    uVar3 = uVar11 >> 0x20;
    uVar11 = uVar11 << 0x20 | uVar3;
    lVar1 = *(long *)((long)auStack_8b8 + lVar10 + 0x18);
    lVar2 = *(long *)((long)auStack_8b8 + lVar10 + 0x50);
    uVar4 = (lVar2 * 2 & 0x1fffffffeU) * uVar3 + uVar11 + lVar2;
    uVar3 = (uVar18 ^ uVar4) >> 0x18;
    uVar6 = (uVar18 ^ uVar4) << 0x28 | uVar3;
    uVar17 = (uVar16 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar6 + uVar16;
    uVar11 = uVar11 ^ uVar17;
    uVar3 = uVar11 >> 0x10;
    uVar12 = uVar11 << 0x30 | uVar3;
    uVar18 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x38);
    uVar8 = (lVar1 * 2 & 0x1fffffffeU) * (uVar18 & 0xffffffff) + lVar1 + uVar18;
    uVar16 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x78) ^ uVar8;
    uVar11 = uVar16 >> 0x20;
    uVar13 = uVar16 << 0x20 | uVar11;
    uVar5 = (uVar4 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar12 + uVar4;
    lVar1 = *(long *)((long)auStack_8b8 + lVar10 + 0x58);
    uVar16 = (lVar1 * 2 & 0x1fffffffeU) * uVar11 + uVar13 + lVar1;
    uVar3 = (uVar18 ^ uVar16) >> 0x18;
    uVar19 = (uVar18 ^ uVar16) << 0x28 | uVar3;
    uVar9 = (uVar8 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar8 + uVar19;
    uVar13 = uVar13 ^ uVar9;
    uVar3 = uVar13 >> 0x10;
    uVar14 = uVar13 << 0x30 | uVar3;
    lVar1 = *(long *)((long)auStack_8b8 + lVar10 + 0x20);
    uVar18 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x40);
    uVar21 = (lVar1 * 2 & 0x1fffffffeU) * (uVar18 & 0xffffffff) + uVar18 + lVar1;
    uVar4 = *(ulong *)((long)local_830.v + lVar10 + -8) ^ uVar21;
    uVar11 = uVar4 >> 0x20;
    uVar8 = uVar4 << 0x20 | uVar11;
    lVar1 = *(long *)((long)auStack_8b8 + lVar10 + 0x60);
    uVar4 = (lVar1 * 2 & 0x1fffffffeU) * uVar11 + uVar8 + lVar1;
    uVar11 = (uVar18 ^ uVar4) >> 0x18;
    uVar13 = (uVar18 ^ uVar4) << 0x28 | uVar11;
    uVar22 = (uVar21 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff) + uVar13 + uVar21;
    uVar8 = uVar8 ^ uVar22;
    uVar11 = uVar8 >> 0x10;
    uVar15 = uVar8 << 0x30 | uVar11;
    uVar7 = (uVar16 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar14 + uVar16;
    lVar1 = *(long *)((long)auStack_8b8 + lVar10 + 0x28);
    uVar18 = *(ulong *)((long)auStack_8b8 + lVar10 + 0x48);
    uVar20 = (lVar1 * 2 & 0x1fffffffeU) * (uVar18 & 0xffffffff) + lVar1 + uVar18;
    uVar16 = *(ulong *)((long)local_830.v + lVar10) ^ uVar20;
    uVar3 = uVar16 >> 0x20;
    uVar8 = uVar16 << 0x20 | uVar3;
    lVar1 = *(long *)((long)auStack_8b8 + lVar10 + 0x68);
    uVar16 = (lVar1 * 2 & 0x1fffffffeU) * uVar3 + uVar8 + lVar1;
    uVar3 = (uVar18 ^ uVar16) >> 0x18;
    uVar21 = (uVar18 ^ uVar16) << 0x28 | uVar3;
    uVar11 = (uVar4 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff) + uVar15 + uVar4;
    uVar20 = (uVar20 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar20 + uVar21;
    uVar8 = uVar8 ^ uVar20;
    uVar18 = uVar8 >> 0x10;
    uVar4 = uVar8 << 0x30 | uVar18;
    uVar16 = (uVar16 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar4 + uVar16;
    uVar19 = uVar19 ^ uVar7;
    uVar18 = uVar19 << 1;
    uVar3 = (ulong)((long)uVar19 < 0);
    uVar19 = uVar18 | uVar3;
    uVar8 = (uVar17 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff | uVar3) + uVar17 + uVar19;
    uVar4 = uVar4 ^ uVar8;
    uVar18 = uVar4 >> 0x20;
    uVar3 = uVar4 << 0x20 | uVar18;
    uVar13 = uVar13 ^ uVar11;
    uVar4 = (uVar11 * 2 & 0x1fffffffe) * uVar18 + uVar3 + uVar11;
    uVar19 = uVar19 ^ uVar4;
    uVar18 = uVar19 >> 0x18;
    uVar19 = uVar19 << 0x28 | uVar18;
    uVar18 = (uVar8 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar8 + uVar19;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x10) = uVar18;
    uVar18 = uVar18 ^ uVar3;
    uVar11 = uVar18 >> 0x10;
    uVar17 = uVar18 << 0x30 | uVar11;
    *(ulong *)((long)local_830.v + lVar10) = uVar17;
    uVar18 = uVar13 << 1;
    uVar3 = (ulong)((long)uVar13 < 0);
    uVar8 = uVar18 | uVar3;
    uVar11 = (uVar4 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff) + uVar17 + uVar4;
    uVar21 = uVar21 ^ uVar16;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x60) = uVar11;
    uVar13 = (uVar9 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff | uVar3) + uVar8 + uVar9;
    uVar12 = uVar12 ^ uVar13;
    uVar18 = uVar12 >> 0x20;
    uVar9 = uVar12 << 0x20 | uVar18;
    uVar11 = uVar11 ^ uVar19;
    uVar3 = (uVar16 * 2 & 0x1fffffffe) * uVar18 + uVar16 + uVar9;
    uVar8 = uVar8 ^ uVar3;
    uVar18 = uVar8 >> 0x18;
    uVar4 = uVar8 << 0x28 | uVar18;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x38) = uVar11 << 1 | (ulong)((long)uVar11 < 0);
    uVar11 = (uVar13 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar4 + uVar13;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x18) = uVar11;
    uVar11 = uVar11 ^ uVar9;
    uVar18 = uVar11 >> 0x10;
    uVar11 = uVar11 << 0x30 | uVar18;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x70) = uVar11;
    uVar11 = (uVar3 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar11 + uVar3;
    uVar18 = uVar21 << 1;
    uVar3 = (ulong)((long)uVar21 < 0);
    uVar16 = uVar18 | uVar3;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x68) = uVar11;
    uVar11 = uVar11 ^ uVar4;
    uVar6 = uVar6 ^ uVar5;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x40) = uVar11 << 1 | (ulong)((long)uVar11 < 0);
    uVar11 = (uVar22 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff | uVar3) + uVar22 + uVar16;
    uVar14 = uVar14 ^ uVar11;
    uVar18 = uVar14 >> 0x20;
    uVar3 = uVar14 << 0x20 | uVar18;
    uVar8 = (uVar5 * 2 & 0x1fffffffe) * uVar18 + uVar3 + uVar5;
    uVar16 = uVar16 ^ uVar8;
    uVar18 = uVar16 >> 0x18;
    uVar4 = uVar16 << 0x28 | uVar18;
    uVar18 = (uVar11 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar11 + uVar4;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x20) = uVar18;
    uVar18 = uVar18 ^ uVar3;
    uVar11 = uVar18 >> 0x10;
    uVar13 = uVar18 << 0x30 | uVar11;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x78) = uVar13;
    uVar18 = uVar6 << 1;
    uVar3 = (ulong)((long)uVar6 < 0);
    uVar16 = uVar18 | uVar3;
    uVar11 = (uVar8 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff) + uVar13 + uVar8;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x50) = uVar11;
    uVar11 = uVar11 ^ uVar4;
    uVar8 = (uVar20 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff | uVar3) + uVar20 + uVar16;
    uVar15 = uVar15 ^ uVar8;
    uVar18 = uVar15 >> 0x20;
    uVar4 = uVar15 << 0x20 | uVar18;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x48) = uVar11 << 1 | (ulong)((long)uVar11 < 0);
    uVar3 = (uVar7 * 2 & 0x1fffffffe) * uVar18 + uVar4 + uVar7;
    uVar16 = uVar16 ^ uVar3;
    uVar18 = uVar16 >> 0x18;
    uVar11 = uVar16 << 0x28 | uVar18;
    uVar16 = (uVar8 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar11 + uVar8;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x28) = uVar16;
    uVar16 = uVar16 ^ uVar4;
    uVar18 = uVar16 >> 0x10;
    uVar4 = uVar16 << 0x30 | uVar18;
    *(ulong *)((long)local_830.v + lVar10 + -8) = uVar4;
    uVar18 = (uVar3 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar4 + uVar3;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x58) = uVar18;
    uVar18 = uVar18 ^ uVar11;
    *(ulong *)((long)auStack_8b8 + lVar10 + 0x30) = uVar18 << 1 | (ulong)((long)uVar18 < 0);
    lVar10 = lVar10 + 0x80;
  } while (lVar10 != 0x478);
  lVar10 = 0x388;
  do {
    uVar18 = *(ulong *)((long)auStack_ab8 + lVar10);
    uVar16 = (*(long *)((long)auStack_bb8 + lVar10) * 2 & 0x1fffffffeU) * (uVar18 & 0xffffffff) +
             uVar18 + *(long *)((long)auStack_bb8 + lVar10);
    uVar11 = *(ulong *)((long)auStack_8b8 + lVar10) ^ uVar16;
    uVar3 = uVar11 >> 0x20;
    uVar11 = uVar11 << 0x20 | uVar3;
    lVar1 = *(long *)((long)auStack_bb8 + lVar10 + 8);
    uVar4 = (*(long *)((long)auStack_9b8 + lVar10) * 2 & 0x1fffffffeU) * uVar3 +
            uVar11 + *(long *)((long)auStack_9b8 + lVar10);
    uVar3 = (uVar18 ^ uVar4) >> 0x18;
    auStack_8b8[0xf] = (uVar18 ^ uVar4) << 0x28 | uVar3;
    uVar9 = (uVar16 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + auStack_8b8[0xf] + uVar16;
    uVar11 = uVar11 ^ uVar9;
    uVar3 = uVar11 >> 0x10;
    auStack_8b8[0xc] = uVar11 << 0x30 | uVar3;
    uVar18 = *(ulong *)((long)auStack_ab8 + lVar10 + 8);
    uVar8 = (lVar1 * 2 & 0x1fffffffeU) * (uVar18 & 0xffffffff) + lVar1 + uVar18;
    uVar16 = *(ulong *)((long)auStack_8b8 + lVar10 + 8) ^ uVar8;
    uVar11 = uVar16 >> 0x20;
    uVar13 = uVar16 << 0x20 | uVar11;
    uVar5 = (uVar4 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + auStack_8b8[0xc] + uVar4;
    lVar1 = *(long *)((long)auStack_9b8 + lVar10 + 8);
    uVar16 = (lVar1 * 2 & 0x1fffffffeU) * uVar11 + uVar13 + lVar1;
    uVar3 = (uVar18 ^ uVar16) >> 0x18;
    uVar12 = (uVar18 ^ uVar16) << 0x28 | uVar3;
    uVar7 = (uVar8 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar8 + uVar12;
    uVar13 = uVar13 ^ uVar7;
    uVar3 = uVar13 >> 0x10;
    auStack_8b8[0xd] = uVar13 << 0x30 | uVar3;
    uVar18 = *(ulong *)((long)auStack_a38 + lVar10);
    uVar21 = (*(long *)((long)auStack_b38 + lVar10) * 2 & 0x1fffffffeU) * (uVar18 & 0xffffffff) +
             uVar18 + *(long *)((long)auStack_b38 + lVar10);
    uVar4 = *(ulong *)((long)local_830.v + lVar10 + -8) ^ uVar21;
    uVar11 = uVar4 >> 0x20;
    uVar8 = uVar4 << 0x20 | uVar11;
    uVar4 = (*(long *)((long)auStack_938 + lVar10) * 2 & 0x1fffffffeU) * uVar11 +
            uVar8 + *(long *)((long)auStack_938 + lVar10);
    uVar11 = (uVar18 ^ uVar4) >> 0x18;
    uVar13 = (uVar18 ^ uVar4) << 0x28 | uVar11;
    uVar15 = (uVar21 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff) + uVar13 + uVar21;
    uVar8 = uVar8 ^ uVar15;
    uVar11 = uVar8 >> 0x10;
    auStack_8b8[0xe] = uVar8 << 0x30 | uVar11;
    uVar6 = (uVar16 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + auStack_8b8[0xd] + uVar16;
    auStack_8b8[0xb] = auStack_8b8[0xe] + uVar4;
    lVar1 = *(long *)((long)auStack_b38 + lVar10 + 8);
    uVar18 = *(ulong *)((long)auStack_a38 + lVar10 + 8);
    uVar14 = (lVar1 * 2 & 0x1fffffffeU) * (uVar18 & 0xffffffff) + lVar1 + uVar18;
    uVar16 = *(ulong *)((long)local_830.v + lVar10) ^ uVar14;
    uVar3 = uVar16 >> 0x20;
    uVar8 = uVar16 << 0x20 | uVar3;
    lVar1 = *(long *)((long)auStack_938 + lVar10 + 8);
    uVar16 = (lVar1 * 2 & 0x1fffffffeU) * uVar3 + uVar8 + lVar1;
    uVar3 = (uVar18 ^ uVar16) >> 0x18;
    uVar21 = (uVar18 ^ uVar16) << 0x28 | uVar3;
    uVar11 = (uVar4 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff) + auStack_8b8[0xb];
    uVar14 = (uVar14 * 2 & 0x1fffffffe) * (uVar3 & 0xffffffff) + uVar14 + uVar21;
    uVar8 = uVar8 ^ uVar14;
    uVar18 = uVar8 >> 0x10;
    uVar4 = uVar8 << 0x30 | uVar18;
    uVar16 = (uVar16 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar4 + uVar16;
    uVar12 = uVar12 ^ uVar6;
    uVar18 = uVar12 << 1;
    uVar3 = (ulong)((long)uVar12 < 0);
    uVar12 = uVar18 | uVar3;
    uVar8 = (uVar9 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff | uVar3) + uVar9 + uVar12;
    uVar4 = uVar4 ^ uVar8;
    uVar18 = uVar4 >> 0x20;
    uVar3 = uVar4 << 0x20 | uVar18;
    uVar13 = uVar13 ^ uVar11;
    uVar4 = (uVar11 * 2 & 0x1fffffffe) * uVar18 + uVar3 + uVar11;
    uVar12 = uVar12 ^ uVar4;
    uVar18 = uVar12 >> 0x18;
    uVar12 = uVar12 << 0x28 | uVar18;
    uVar18 = (uVar8 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar8 + uVar12;
    *(ulong *)((long)auStack_bb8 + lVar10) = uVar18;
    uVar18 = uVar18 ^ uVar3;
    uVar11 = uVar18 >> 0x10;
    uVar9 = uVar18 << 0x30 | uVar11;
    *(ulong *)((long)local_830.v + lVar10) = uVar9;
    uVar18 = uVar13 << 1;
    uVar3 = (ulong)((long)uVar13 < 0);
    uVar8 = uVar18 | uVar3;
    uVar11 = (uVar4 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff) + uVar9 + uVar4;
    uVar21 = uVar21 ^ uVar16;
    *(ulong *)((long)auStack_938 + lVar10) = uVar11;
    uVar13 = (uVar7 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff | uVar3) + uVar8 + uVar7;
    uVar18 = (auStack_8b8[0xc] ^ uVar13) >> 0x20;
    uVar7 = (auStack_8b8[0xc] ^ uVar13) << 0x20 | uVar18;
    uVar11 = uVar11 ^ uVar12;
    uVar3 = (uVar16 * 2 & 0x1fffffffe) * uVar18 + uVar16 + uVar7;
    uVar8 = uVar8 ^ uVar3;
    uVar18 = uVar8 >> 0x18;
    uVar4 = uVar8 << 0x28 | uVar18;
    *(ulong *)((long)auStack_ab8 + lVar10 + 8) = uVar11 << 1 | (ulong)((long)uVar11 < 0);
    uVar11 = (uVar13 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar4 + uVar13;
    *(ulong *)((long)auStack_bb8 + lVar10 + 8) = uVar11;
    uVar11 = uVar11 ^ uVar7;
    uVar18 = uVar11 >> 0x10;
    uVar11 = uVar11 << 0x30 | uVar18;
    *(ulong *)((long)auStack_8b8 + lVar10) = uVar11;
    uVar11 = (uVar3 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar11 + uVar3;
    uVar18 = uVar21 << 1;
    uVar3 = (ulong)((long)uVar21 < 0);
    uVar16 = uVar18 | uVar3;
    *(ulong *)((long)auStack_938 + lVar10 + 8) = uVar11;
    uVar11 = uVar11 ^ uVar4;
    *(ulong *)((long)auStack_a38 + lVar10) = uVar11 << 1 | (ulong)((long)uVar11 < 0);
    uVar11 = (uVar15 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff | uVar3) + uVar15 + uVar16;
    uVar18 = (auStack_8b8[0xd] ^ uVar11) >> 0x20;
    uVar3 = (auStack_8b8[0xd] ^ uVar11) << 0x20 | uVar18;
    uVar8 = (uVar5 * 2 & 0x1fffffffe) * uVar18 + uVar3 + uVar5;
    uVar16 = uVar16 ^ uVar8;
    uVar18 = uVar16 >> 0x18;
    uVar4 = uVar16 << 0x28 | uVar18;
    uVar18 = (uVar11 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar11 + uVar4;
    *(ulong *)((long)auStack_b38 + lVar10) = uVar18;
    uVar18 = uVar18 ^ uVar3;
    uVar11 = uVar18 >> 0x10;
    uVar13 = uVar18 << 0x30 | uVar11;
    *(ulong *)((long)auStack_8b8 + lVar10 + 8) = uVar13;
    uVar18 = (auStack_8b8[0xf] ^ uVar5) << 1;
    uVar3 = (ulong)((long)(auStack_8b8[0xf] ^ uVar5) < 0);
    uVar16 = uVar18 | uVar3;
    uVar11 = (uVar8 * 2 & 0x1fffffffe) * (uVar11 & 0xffffffff) + uVar13 + uVar8;
    *(ulong *)((long)auStack_9b8 + lVar10) = uVar11;
    uVar11 = uVar11 ^ uVar4;
    uVar8 = (uVar14 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff | uVar3) + uVar14 + uVar16;
    uVar18 = (auStack_8b8[0xe] ^ uVar8) >> 0x20;
    uVar4 = (auStack_8b8[0xe] ^ uVar8) << 0x20 | uVar18;
    *(ulong *)((long)auStack_a38 + lVar10 + 8) = uVar11 << 1 | (ulong)((long)uVar11 < 0);
    uVar3 = (uVar6 * 2 & 0x1fffffffe) * uVar18 + uVar4 + uVar6;
    uVar16 = uVar16 ^ uVar3;
    uVar18 = uVar16 >> 0x18;
    uVar11 = uVar16 << 0x28 | uVar18;
    uVar16 = (uVar8 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar11 + uVar8;
    *(ulong *)((long)auStack_b38 + lVar10 + 8) = uVar16;
    uVar16 = uVar16 ^ uVar4;
    uVar18 = uVar16 >> 0x10;
    uVar4 = uVar16 << 0x30 | uVar18;
    *(ulong *)((long)local_830.v + lVar10 + -8) = uVar4;
    uVar18 = (uVar3 * 2 & 0x1fffffffe) * (uVar18 & 0xffffffff) + uVar4 + uVar3;
    *(ulong *)((long)auStack_9b8 + lVar10 + 8) = uVar18;
    uVar18 = uVar18 ^ uVar11;
    *(ulong *)((long)auStack_ab8 + lVar10) = uVar18 << 1 | (ulong)((long)uVar18 < 0);
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x408);
  auStack_8b8[9] = 0x124a0c;
  local_838 = next_block;
  rxa2_copy_block(next_block,&local_430);
  auStack_8b8[9] = 0x124a19;
  rxa2_xor_block(next_block,&local_830);
  return;
}

Assistant:

static void fill_block(const block *prev_block, const block *ref_block,
	block *next_block, int with_xor) {
	block blockR, block_tmp;
	unsigned i;

	rxa2_copy_block(&blockR, ref_block);
	rxa2_xor_block(&blockR, prev_block);
	rxa2_copy_block(&block_tmp, &blockR);
	/* Now blockR = ref_block + prev_block and block_tmp = ref_block + prev_block */
	if (with_xor) {
		/* Saving the next block contents for XOR over: */
		rxa2_xor_block(&block_tmp, next_block);
		/* Now blockR = ref_block + prev_block and
		   block_tmp = ref_block + prev_block + next_block */
	}

	/* Apply Blake2 on columns of 64-bit words: (0,1,...,15) , then
	   (16,17,..31)... finally (112,113,...127) */
	for (i = 0; i < 8; ++i) {
		BLAKE2_ROUND_NOMSG(
			blockR.v[16 * i], blockR.v[16 * i + 1], blockR.v[16 * i + 2],
			blockR.v[16 * i + 3], blockR.v[16 * i + 4], blockR.v[16 * i + 5],
			blockR.v[16 * i + 6], blockR.v[16 * i + 7], blockR.v[16 * i + 8],
			blockR.v[16 * i + 9], blockR.v[16 * i + 10], blockR.v[16 * i + 11],
			blockR.v[16 * i + 12], blockR.v[16 * i + 13], blockR.v[16 * i + 14],
			blockR.v[16 * i + 15]);
	}

	/* Apply Blake2 on rows of 64-bit words: (0,1,16,17,...112,113), then
	   (2,3,18,19,...,114,115).. finally (14,15,30,31,...,126,127) */
	for (i = 0; i < 8; i++) {
		BLAKE2_ROUND_NOMSG(
			blockR.v[2 * i], blockR.v[2 * i + 1], blockR.v[2 * i + 16],
			blockR.v[2 * i + 17], blockR.v[2 * i + 32], blockR.v[2 * i + 33],
			blockR.v[2 * i + 48], blockR.v[2 * i + 49], blockR.v[2 * i + 64],
			blockR.v[2 * i + 65], blockR.v[2 * i + 80], blockR.v[2 * i + 81],
			blockR.v[2 * i + 96], blockR.v[2 * i + 97], blockR.v[2 * i + 112],
			blockR.v[2 * i + 113]);
	}

	rxa2_copy_block(next_block, &block_tmp);
	rxa2_xor_block(next_block, &blockR);
}